

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O3

idx_t duckdb::LocateErrorIndex(bool is_append,ManagedSelection *matches)

{
  sel_t *psVar1;
  uint *puVar2;
  idx_t iVar3;
  undefined7 in_register_00000039;
  bool bVar4;
  
  if ((int)CONCAT71(in_register_00000039,is_append) == 0) {
    puVar2 = (matches->sel_vec).sel_vector;
    if (puVar2 != (uint *)0x0) {
      return (ulong)*puVar2;
    }
    return 0;
  }
  bVar4 = matches->size != 0;
  if (matches->count == 0 || !bVar4) {
    iVar3 = 0;
  }
  else {
    psVar1 = (matches->sel_vec).sel_vector;
    iVar3 = 0;
    do {
      if ((psVar1 != (sel_t *)0x0) && (iVar3 != psVar1[iVar3])) {
        return iVar3;
      }
      iVar3 = iVar3 + 1;
      bVar4 = iVar3 < matches->size;
    } while ((bVar4) && (iVar3 < matches->count));
  }
  if (!bVar4) {
    iVar3 = 0xffffffffffffffff;
  }
  return iVar3;
}

Assistant:

idx_t LocateErrorIndex(bool is_append, const ManagedSelection &matches) {
	// We expected to find nothing, so the first error is the first match.
	if (!is_append) {
		return matches[0];
	}
	// We expected to find matches for all of them, so the first missing match is the first error.
	return FirstMissingMatch(matches);
}